

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_render_pass_attachments2
          (Impl *this,Value *attachments,VkAttachmentDescription2 **out_attachments)

{
  bool bVar1;
  SizeType SVar2;
  uint uVar3;
  VkImageLayout VVar4;
  VkFormat VVar5;
  VkAttachmentLoadOp VVar6;
  VkAttachmentStoreOp VVar7;
  VkSampleCountFlagBits VVar8;
  VkAttachmentDescription2 *pVVar9;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar10;
  Type pGVar11;
  void **outpNext;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *obj
  ;
  
  SVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(attachments);
  pVVar9 = ScratchAllocator::allocate_n_cleared<VkAttachmentDescription2>
                     (&this->allocator,(ulong)SVar2);
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::Begin(attachments);
  outpNext = &pVVar9->pNext;
  while( true ) {
    pGVar10 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               *)rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::End(attachments);
    if (this_00 == pGVar10) break;
    ((VkAttachmentDescription2 *)(outpNext + -1))->sType =
         VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_2;
    pGVar11 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"flags");
    uVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar11);
    *(uint *)(outpNext + 1) = uVar3;
    pGVar11 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"finalLayout");
    VVar4 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar11);
    *(VkImageLayout *)(outpNext + 5) = VVar4;
    pGVar11 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"initialLayout");
    VVar4 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar11);
    *(VkImageLayout *)((long)outpNext + 0x24) = VVar4;
    pGVar11 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"format");
    VVar5 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar11);
    *(VkFormat *)((long)outpNext + 0xc) = VVar5;
    pGVar11 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"loadOp");
    VVar6 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar11);
    *(VkAttachmentLoadOp *)((long)outpNext + 0x14) = VVar6;
    pGVar11 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"storeOp");
    VVar7 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar11);
    *(VkAttachmentStoreOp *)(outpNext + 3) = VVar7;
    pGVar11 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"stencilLoadOp");
    VVar6 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar11);
    *(VkAttachmentLoadOp *)((long)outpNext + 0x1c) = VVar6;
    pGVar11 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"stencilStoreOp");
    VVar7 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar11);
    *(VkAttachmentStoreOp *)(outpNext + 4) = VVar7;
    pGVar11 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"samples");
    VVar8 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar11);
    *(VkSampleCountFlagBits *)(outpNext + 2) = VVar8;
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)this_00,"pNext");
    if (bVar1) {
      pGVar11 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>(this_00,"pNext");
      bVar1 = parse_pnext_chain(this,pGVar11,outpNext,(StateCreatorInterface *)0x0,
                                (DatabaseInterface *)0x0,(Value *)0x0);
      if (!bVar1) goto LAB_0010bb0c;
    }
    this_00 = this_00 + 0x10;
    outpNext = outpNext + 7;
  }
  *out_attachments = pVVar9;
LAB_0010bb0c:
  return this_00 == pGVar10;
}

Assistant:

bool StateReplayer::Impl::parse_render_pass_attachments2(const Value &attachments, const VkAttachmentDescription2 **out_attachments)
{
	auto *infos = allocator.allocate_n_cleared<VkAttachmentDescription2>(attachments.Size());
	auto *ret = infos;

	for (auto itr = attachments.Begin(); itr != attachments.End(); ++itr, infos++)
	{
		auto &obj = *itr;
		infos->sType = VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_2;
		parse_render_pass_attachments_base(*infos, *itr);
		if (obj.HasMember("pNext"))
			if (!parse_pnext_chain(obj["pNext"], &infos->pNext))
				return false;
	}

	*out_attachments = ret;
	return true;
}